

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

void __thiscall
kj::anon_unknown_35::InMemoryDirectory::EntryImpl::set(EntryImpl *this,Own<const_kj::File> *value)

{
  Disposer *pDVar1;
  File *pFVar2;
  
  pDVar1 = value->disposer;
  pFVar2 = value->ptr;
  value->ptr = (File *)0x0;
  if ((this->node).tag != 0) {
    OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
    ::destroy(&this->node);
  }
  (this->node).field_1.forceAligned = pDVar1;
  *(File **)((long)&(this->node).field_1 + 8) = pFVar2;
  (this->node).tag = 1;
  return;
}

Assistant:

void set(Own<const File>&& value) {
      node.init<FileNode>(FileNode { kj::mv(value) });
    }